

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ParserReset(Parse *pParse)

{
  undefined8 *in_RDI;
  sqlite3 *db;
  ExprList *in_stack_ffffffffffffffe8;
  sqlite3 *db_00;
  
  db_00 = (sqlite3 *)*in_RDI;
  sqlite3DbFree(db_00,in_stack_ffffffffffffffe8);
  sqlite3ExprListDelete(db_00,in_stack_ffffffffffffffe8);
  if (db_00 != (sqlite3 *)0x0) {
    (db_00->lookaside).bDisable = (db_00->lookaside).bDisable - (uint)*(byte *)((long)in_RDI + 0x24)
    ;
  }
  *(undefined1 *)((long)in_RDI + 0x24) = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ParserReset(Parse *pParse){
  sqlite3 *db = pParse->db;
  sqlite3DbFree(db, pParse->aLabel);
  sqlite3ExprListDelete(db, pParse->pConstExpr);
  if( db ){
    assert( db->lookaside.bDisable >= pParse->disableLookaside );
    db->lookaside.bDisable -= pParse->disableLookaside;
  }
  pParse->disableLookaside = 0;
}